

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O2

String * __thiscall
nigel::AstVariable::modelString_abi_cxx11_(String *__return_storage_ptr__,AstVariable *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*(undefined4 *)&(this->super_AstReturning).field_0x34) {
  case 0:
    pcVar2 = "fast";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "large";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "stack";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "heap";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "param";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "-!-UNKNOWN-!-";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

String modelString()
		{
			if( model == MemModel::fast ) return "fast";
			else if( model == MemModel::large ) return "large";
			else if( model == MemModel::stack ) return "stack";
			else if( model == MemModel::heap ) return "heap";
			else if( model == MemModel::param ) return "param";
			else return "-!-UNKNOWN-!-";
		}